

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::Texture2DArrayFilteringCase::Texture2DArrayFilteringCase
          (Texture2DArrayFilteringCase *this,Context *context,char *name,char *desc,
          deUint32 minFilter,deUint32 magFilter,deUint32 wrapS,deUint32 wrapT,
          deUint32 internalFormat,int width,int height,int numLayers)

{
  RenderContext *context_00;
  TestContext *this_00;
  TestLog *log;
  deUint32 magFilter_local;
  deUint32 minFilter_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  Texture2DArrayFilteringCase *this_local;
  
  gles3::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Texture2DArrayFilteringCase_0329b240;
  this->m_minFilter = minFilter;
  this->m_magFilter = magFilter;
  this->m_wrapS = wrapS;
  this->m_wrapT = wrapT;
  this->m_internalFormat = internalFormat;
  this->m_width = width;
  this->m_height = height;
  this->m_numLayers = numLayers;
  this->m_gradientTex = (Texture2DArray *)0x0;
  this->m_gridTex = (Texture2DArray *)0x0;
  context_00 = gles3::Context::getRenderContext(context);
  this_00 = gles3::Context::getTestContext(context);
  log = tcu::TestContext::getLog(this_00);
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,context_00,log,GLSL_VERSION_300_ES,PRECISION_HIGHP);
  std::
  vector<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
  ::vector(&this->m_cases);
  this->m_caseNdx = 0;
  return;
}

Assistant:

Texture2DArrayFilteringCase::Texture2DArrayFilteringCase (Context& context, const char* name, const char* desc, deUint32 minFilter, deUint32 magFilter, deUint32 wrapS, deUint32 wrapT, deUint32 internalFormat, int width, int height, int numLayers)
	: TestCase			(context, name, desc)
	, m_minFilter		(minFilter)
	, m_magFilter		(magFilter)
	, m_wrapS			(wrapS)
	, m_wrapT			(wrapT)
	, m_internalFormat	(internalFormat)
	, m_width			(width)
	, m_height			(height)
	, m_numLayers		(numLayers)
	, m_gradientTex		(DE_NULL)
	, m_gridTex			(DE_NULL)
	, m_renderer		(context.getRenderContext(), context.getTestContext().getLog(), glu::GLSL_VERSION_300_ES, glu::PRECISION_HIGHP)
	, m_caseNdx			(0)
{
}